

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pthread.cc
# Opt level: O2

void __thiscall
gutil::Thread::create(Thread *this,ParallelFunction *fct,long start,long end,long step,int affinity)

{
  ThreadData *__arg;
  int iVar1;
  int iVar2;
  cpu_set_t cpuset;
  pthread_attr_t attr;
  
  if (this->p->running == true) {
    pthread_cancel(this->p->thread);
    pthread_join(this->p->thread,(void **)0x0);
    this->p->running = false;
  }
  pthread_attr_init((pthread_attr_t *)&attr);
  if (-1 < affinity) {
    iVar1 = getMaxThreads();
    if (1 < iVar1) {
      iVar1 = getMaxThreads();
      iVar2 = getProcessingUnits();
      if (iVar1 == iVar2) {
        cpuset.__bits[0xe] = 0;
        cpuset.__bits[0xf] = 0;
        cpuset.__bits[0xc] = 0;
        cpuset.__bits[0xd] = 0;
        cpuset.__bits[10] = 0;
        cpuset.__bits[0xb] = 0;
        cpuset.__bits[8] = 0;
        cpuset.__bits[9] = 0;
        cpuset.__bits[6] = 0;
        cpuset.__bits[7] = 0;
        cpuset.__bits[4] = 0;
        cpuset.__bits[5] = 0;
        cpuset.__bits[2] = 0;
        cpuset.__bits[3] = 0;
        cpuset.__bits[0] = 0;
        cpuset.__bits[1] = 0;
        if ((uint)affinity < 0x400) {
          cpuset.__bits[(uint)affinity >> 6] =
               cpuset.__bits[(uint)affinity >> 6] | 1L << ((byte)affinity & 0x3f);
        }
        pthread_attr_setaffinity_np((pthread_attr_t *)&attr,0x80,(cpu_set_t *)&cpuset);
      }
    }
  }
  __arg = this->p;
  __arg->tfct = (ThreadFunction *)0x0;
  __arg->pfct = fct;
  __arg->start = start;
  __arg->end = end;
  __arg->step = step;
  pthread_create(&__arg->thread,(pthread_attr_t *)&attr,anon_unknown_0::ptfct,__arg);
  pthread_attr_destroy((pthread_attr_t *)&attr);
  this->p->running = true;
  return;
}

Assistant:

void Thread::create(ParallelFunction &fct, long start, long end, long step,
                    int affinity)
{
  if (p->running)
  {
    pthread_cancel(p->thread);
    pthread_join(p->thread, 0);
    p->running=false;
  }

  pthread_attr_t attr;
  pthread_attr_init(&attr);

#ifdef _GNU_SOURCE

  if (affinity >= 0 && getMaxThreads() > 1 &&
      getMaxThreads() == getProcessingUnits())
  {
    cpu_set_t cpuset;
    CPU_ZERO(&cpuset);
    CPU_SET(affinity, &cpuset);

    pthread_attr_setaffinity_np(&attr, sizeof(cpu_set_t), &cpuset);
  }

#endif

  p->tfct=0;
  p->pfct=&fct;
  p->start=start;
  p->end=end;
  p->step=step;

#ifndef NDEBUG
  int err=
#endif
    pthread_create(&(p->thread), &attr, ptfct, p);

  pthread_attr_destroy(&attr);

  assert(err == 0);

  p->running=true;
}

void Thread::join()
{
  if (p->running)
  {
#ifndef NDEBUG
    int err=
#endif
      pthread_join(p->thread, 0);

    p->running=false;

    assert(err == 0);
  }
}

namespace
{

int procunits=0;
int nthreads=0;

}

int Thread::getProcessingUnits()
{
  if (procunits <= 0)
  {
#ifdef _SC_NPROCESSORS_CONF
    procunits=sysconf(_SC_NPROCESSORS_CONF);
#endif

    if (procunits <= 0)
    {
      std::cerr << "Cannot determine number of CPUs, assuming one!" << std::endl;
      procunits=1;
    }

    const char *s=std::getenv("CVKIT_MAX_THREADS");

    if (s != 0)
    {
      int n=std::max(1, std::atoi(s));

      if (n < procunits)
      {
        procunits=n;
      }
    }
  }

  return procunits;
}

int Thread::getMaxThreads()
{
  if (nthreads <= 0)
  {
    nthreads=getProcessingUnits();
  }

  return nthreads;
}

void Thread::setMaxThreads(int n)
{
  if (n <= 0 || n > getProcessingUnits())
  {
    n=getProcessingUnits();
  }

  nthreads=n;
}

}